

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void erase_suite::erase_beginning(void)

{
  pair<int,_int> pVar1;
  pair<int,_int> pVar2;
  pair<int,_int> pVar3;
  initializer_list<vista::pair<int,_int>_> __l;
  initializer_list<vista::pair<int,_int>_> __l_00;
  initializer_list<vista::pair<int,_int>_> __l_01;
  initializer_list<vista::pair<int,_int>_> __l_02;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect_1;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect;
  allocator_type aStack_89;
  undefined8 local_88;
  pair<int,_int> pStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  pair<int,_int> local_68;
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> local_48;
  undefined8 uStack_30;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> local_28;
  
  pStack_80.first = 0;
  pStack_80.second = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0x10000000b;
  local_58 = (pair<int,_int>)&pStack_80;
  if (&pStack_80 != &local_68) {
    pStack_80.first = 0x16;
    pStack_80.second = 2;
    pVar2 = (pair<int,_int>)&pStack_80;
    local_58 = (pair<int,_int>)&local_78;
    if (pVar2 != (pair<int,_int>)&local_88 && &local_88 != &local_78) {
      do {
        if (((pair<int,_int> *)((long)pVar2 + -8))->first <= *(int *)pVar2) break;
        pVar3 = *(pair<int,_int> *)pVar2;
        *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + -8);
        *(pair<int,_int> *)((long)pVar2 + -8) = pVar3;
        pVar2 = (pair<int,_int>)((long)pVar2 + -8);
      } while (pVar2 != (pair<int,_int>)&local_88);
    }
  }
  pVar2 = local_58;
  if (local_58 != (pair<int,_int>)&local_68) {
    pVar2 = (pair<int,_int>)((long)local_58 + 8);
    *(pair<int,_int> *)local_58 = (pair<int,_int>)0x300000021;
    if (local_58 != (pair<int,_int>)&local_88 && (pair<int,_int>)&local_88 != pVar2) {
      do {
        if (((pair<int,_int> *)((long)local_58 + -8))->first <= *(int *)local_58) break;
        pVar3 = *(pair<int,_int> *)local_58;
        *(pair<int,_int> *)local_58 = *(pair<int,_int> *)((long)local_58 + -8);
        *(pair<int,_int> *)((long)local_58 + -8) = pVar3;
        local_58 = (pair<int,_int>)((long)local_58 + -8);
      } while (local_58 != (pair<int,_int>)&local_88);
    }
  }
  local_58 = pVar2;
  pVar2 = local_58;
  if (local_58 != (pair<int,_int>)&local_68) {
    pVar2 = (pair<int,_int>)((long)local_58 + 8);
    *(pair<int,_int> *)local_58 = (pair<int,_int>)0x40000002c;
    if (local_58 != (pair<int,_int>)&local_88 && (pair<int,_int>)&local_88 != pVar2) {
      do {
        if (((pair<int,_int> *)((long)local_58 + -8))->first <= *(int *)local_58) break;
        pVar3 = *(pair<int,_int> *)local_58;
        *(pair<int,_int> *)local_58 = *(pair<int,_int> *)((long)local_58 + -8);
        *(pair<int,_int> *)((long)local_58 + -8) = pVar3;
        local_58 = (pair<int,_int>)((long)local_58 + -8);
      } while (local_58 != (pair<int,_int>)&local_88);
    }
  }
  local_58 = pVar2;
  local_48.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  uStack_30 = 0x40000002c;
  local_48.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  local_48.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x200000016;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  local_68 = (pair<int,_int>)&local_88;
  local_60 = (pair<int,_int>)&local_68;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_28,__l,&aStack_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x16b,"void erase_suite::erase_beginning()",(pair<int,_int> *)local_68,
             (pair<int,_int> *)local_58,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_28.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_28.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_28.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_68;
  if (((local_58 != local_68) &&
      (*(pair<int,_int> *)local_68 = (pair<int,_int>)0x0, local_58 != pVar2)) &&
     (pVar3 = (pair<int,_int>)((long)local_58 + -8), local_58 = pVar3, pVar3 != pVar2)) {
    pVar1 = *(pair<int,_int> *)pVar2;
    do {
      *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + 8);
      *(pair<int,_int> *)((long)pVar2 + 8) = pVar1;
      pVar2 = (pair<int,_int>)((long)pVar2 + 8);
    } while (pVar2 != pVar3);
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x200000016;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x300000021;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x40000002c;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_48,__l_00,&aStack_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x172,"void erase_suite::erase_beginning()",(pair<int,_int> *)local_68,
             (pair<int,_int> *)local_58,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_48.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_48.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_48.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_68;
  if (((local_58 != local_68) &&
      (*(pair<int,_int> *)local_68 = (pair<int,_int>)0x0, local_58 != pVar2)) &&
     (pVar3 = (pair<int,_int>)((long)local_58 + -8), local_58 = pVar3, pVar3 != pVar2)) {
    pVar1 = *(pair<int,_int> *)pVar2;
    do {
      *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + 8);
      *(pair<int,_int> *)((long)pVar2 + 8) = pVar1;
      pVar2 = (pair<int,_int>)((long)pVar2 + 8);
    } while (pVar2 != pVar3);
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x300000021;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x40000002c;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_48,__l_01,&aStack_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x178,"void erase_suite::erase_beginning()",(pair<int,_int> *)local_68,
             (pair<int,_int> *)local_58,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_48.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_48.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_48.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_68;
  if (((local_58 != local_68) &&
      (*(pair<int,_int> *)local_68 = (pair<int,_int>)0x0, local_58 != pVar2)) &&
     (pVar3 = (pair<int,_int>)((long)local_58 + -8), local_58 = pVar3, pVar3 != pVar2)) {
    pVar1 = *(pair<int,_int> *)pVar2;
    do {
      *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + 8);
      *(pair<int,_int> *)((long)pVar2 + 8) = pVar1;
      pVar2 = (pair<int,_int>)((long)pVar2 + 8);
    } while (pVar2 != pVar3);
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x40000002c;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_48,__l_02,&aStack_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x17e,"void erase_suite::erase_beginning()",(pair<int,_int> *)local_68,
             (pair<int,_int> *)local_58,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_48.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_48.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_48.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_68;
  if (((local_58 != local_68) &&
      (*(pair<int,_int> *)local_68 = (pair<int,_int>)0x0, local_58 != pVar2)) &&
     (pVar3 = (pair<int,_int>)((long)local_58 + -8), local_58 = pVar3, pVar3 != pVar2)) {
    pVar1 = *(pair<int,_int> *)pVar2;
    do {
      *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + 8);
      *(pair<int,_int> *)((long)pVar2 + 8) = pVar1;
      pVar2 = (pair<int,_int>)((long)pVar2 + 8);
    } while (pVar2 != pVar3);
  }
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x184,"void erase_suite::erase_beginning()",(pair<int,_int> *)local_68,
             (pair<int,_int> *)local_58,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )0x0,(__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
                    )0x0);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}